

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall
tetgenmesh::report_selfint_face
          (tetgenmesh *this,point p1,point p2,point p3,face *sface,triface *iedge,int intflag,
          int *types,int *poss)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  point pdVar7;
  point local_b0;
  point touchpt;
  point crosspt;
  double u;
  double ip [3];
  face parentsh;
  int facemark;
  int geomtag;
  int etype;
  point e3;
  point e2;
  point e1;
  face iface;
  triface *iedge_local;
  face *sface_local;
  point p3_local;
  point p2_local;
  point p1_local;
  tetgenmesh *this_local;
  
  iface._8_8_ = iedge;
  face::face((face *)&e1);
  e2 = (point)0x0;
  e3 = (point)0x0;
  _geomtag = (point)0x0;
  facemark = 0;
  parentsh._12_4_ = 0;
  uVar2 = shellmark(this,sface);
  if ((*(long *)(*(long *)iface._8_8_ + 0x48) == 0) ||
     (*(long *)(*(long *)(*(long *)iface._8_8_ + 0x48) +
               (long)(int)(*(uint *)(iface._8_8_ + 8) & 3) * 8) == 0)) {
    if ((*(long *)(*(long *)iface._8_8_ + 0x40) == 0) ||
       (*(long *)(*(long *)(*(long *)iface._8_8_ + 0x40) +
                 (long)ver2edge[*(int *)(iface._8_8_ + 8)] * 8) == 0)) {
      terminatetetgen(this,2);
    }
    else {
      tsspivot1(this,(triface *)iface._8_8_,(face *)&e1);
      e2 = farsorg(this,(face *)&e1);
      e3 = farsdest(this,(face *)&e1);
      facemark = 1;
      face::face((face *)(ip + 2));
      spivot(this,(face *)&e1,(face *)(ip + 2));
      parentsh._12_4_ = shellmark(this,(face *)(ip + 2));
    }
  }
  else {
    tspivot(this,(triface *)iface._8_8_,(face *)&e1);
    e2 = sorg(this,(face *)&e1);
    e3 = sdest(this,(face *)&e1);
    _geomtag = sapex(this,(face *)&e1);
    facemark = 2;
    parentsh._12_4_ = uVar2;
  }
  if (intflag == 2) {
    crosspt = (point)0x0;
    planelineint(this,p1,p2,p3,e2,e3,&u,(double *)&crosspt);
    if ((*types == 9) || (*types == 8)) {
      if (facemark == 1) {
        printf("PLC Error:  A segment and a facet intersect at point");
        printf(" (%g,%g,%g).\n",u,ip[0],ip[1]);
        uVar3 = pointmark(this,e2);
        uVar4 = pointmark(this,e3);
        uVar5 = shellmark(this,(face *)&e1);
        printf("  Segment: [%d,%d] #%d (%d)\n",(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,
               (ulong)(uint)parentsh._12_4_);
        uVar3 = pointmark(this,p1);
        uVar4 = pointmark(this,p2);
        uVar5 = pointmark(this,p3);
        printf("  Facet:   [%d,%d,%d] #%d\n",(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar2);
      }
      else {
        printf("PLC Error:  Two facets intersect at point");
        printf(" (%g,%g,%g).\n",u,ip[0],ip[1]);
        uVar3 = pointmark(this,e2);
        uVar4 = pointmark(this,e3);
        pdVar7 = sorg(this,(face *)&e1);
        uVar5 = pointmark(this,pdVar7);
        uVar6 = shellmark(this,(face *)&e1);
        printf("  Facet 1: [%d,%d,%d] #%d\n",(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
        uVar3 = pointmark(this,p1);
        uVar4 = pointmark(this,p2);
        uVar5 = pointmark(this,p3);
        printf("  Facet 2: [%d,%d,%d] #%d\n",(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar2);
      }
    }
    else if (*types == 7) {
      touchpt = (point)0x0;
      pdVar7 = p1;
      if (((*poss != 0) && (pdVar7 = p2, *poss != 1)) && (pdVar7 = p3, *poss != 2)) {
        terminatetetgen(this,2);
        pdVar7 = touchpt;
      }
      touchpt = pdVar7;
      bVar1 = issteinerpoint(this,touchpt);
      if (bVar1) {
        terminatetetgen(this,2);
      }
      else if (facemark == 1) {
        printf("PLC Error:  A vertex and a segment intersect at (%g,%g,%g)\n",*touchpt,touchpt[1],
               touchpt[2]);
        uVar2 = pointmark(this,touchpt);
        printf("  Vertex:  #%d\n",(ulong)uVar2);
        uVar2 = pointmark(this,e2);
        uVar3 = pointmark(this,e3);
        uVar4 = shellmark(this,(face *)&e1);
        printf("  Segment: [%d,%d] #%d (%d)\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
               (ulong)(uint)parentsh._12_4_);
      }
      else {
        printf("PLC Error:  A vertex and a facet intersect at (%g,%g,%g)\n",*touchpt,touchpt[1],
               touchpt[2]);
        uVar3 = pointmark(this,touchpt);
        printf("  Vertex:  #%d\n",(ulong)uVar3);
        uVar3 = pointmark(this,p1);
        uVar4 = pointmark(this,p2);
        uVar5 = pointmark(this,p3);
        printf("  Facet:   [%d,%d,%d] #%d\n",(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar2);
      }
    }
    else if ((*types == 6) || (*types == 5)) {
      local_b0 = (point)0x0;
      if (poss[1] == 0) {
        local_b0 = org(this,(triface *)iface._8_8_);
      }
      else if (poss[1] == 1) {
        local_b0 = dest(this,(triface *)iface._8_8_);
      }
      else {
        terminatetetgen(this,2);
      }
      bVar1 = issteinerpoint(this,local_b0);
      if (bVar1) {
        terminatetetgen(this,2);
      }
      else {
        printf("PLC Error:  A vertex and a facet intersect at (%g,%g,%g)\n",*local_b0,local_b0[1],
               local_b0[2]);
        uVar3 = pointmark(this,local_b0);
        printf("  Vertex:  #%d\n",(ulong)uVar3);
        uVar3 = pointmark(this,p1);
        uVar4 = pointmark(this,p2);
        uVar5 = pointmark(this,p3);
        printf("  Facet:   [%d,%d,%d] #%d\n",(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar2);
      }
    }
    else if (*types == 2) {
      terminatetetgen(this,2);
    }
    else {
      terminatetetgen(this,2);
    }
  }
  else if (intflag == 4) {
    if (*types == 4) {
      printf("PLC Error:  Two facets are overlapping.\n");
      uVar3 = pointmark(this,e2);
      uVar4 = pointmark(this,e3);
      uVar5 = pointmark(this,_geomtag);
      printf("  Facet 1:   [%d,%d,%d] #%d\n",(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,
             (ulong)(uint)parentsh._12_4_);
      uVar3 = pointmark(this,p1);
      uVar4 = pointmark(this,p2);
      uVar5 = pointmark(this,p3);
      printf("  Facet 2:   [%d,%d,%d] #%d\n",(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar2);
    }
    else {
      terminatetetgen(this,2);
    }
  }
  else {
    terminatetetgen(this,2);
  }
  terminatetetgen(this,3);
  return 0;
}

Assistant:

int tetgenmesh::report_selfint_face(point p1, point p2, point p3, face* sface,
  triface* iedge, int intflag, int* types, int* poss)
{
  face iface;
  point e1 = NULL, e2 = NULL, e3 = NULL;
  int etype = 0, geomtag = 0, facemark = 0;

  geomtag = shellmark(*sface);

  if (issubface(*iedge)) {
    tspivot(*iedge, iface);
    e1 = sorg(iface);
    e2 = sdest(iface);
    e3 = sapex(iface);
    etype = 2;
    facemark = geomtag;
  } else if (issubseg(*iedge)) {
    tsspivot1(*iedge, iface);
    e1 = farsorg(iface);
    e2 = farsdest(iface);
    etype = 1;
    face parentsh;
    spivot(iface, parentsh);
    facemark = shellmark(parentsh);
  } else {
    terminatetetgen(this, 2);
  }

  if (intflag == 2) {
    // The triangle and the edge intersect only at one point.
    REAL ip[3], u = 0;
    planelineint(p1, p2, p3, e1, e2, ip, &u);
    if ((types[0] == (int) ACROSSFACE) ||
        (types[0] == (int) ACROSSEDGE)) {
      // The triangle and the edge intersect in their interiors. 
      if (etype == 1) {
        printf("PLC Error:  A segment and a facet intersect at point");
        printf(" (%g,%g,%g).\n", ip[0], ip[1], ip[2]);
        printf("  Segment: [%d,%d] #%d (%d)\n", pointmark(e1), pointmark(e2),
               shellmark(iface), facemark);
        printf("  Facet:   [%d,%d,%d] #%d\n", pointmark(p1), 
               pointmark(p2), pointmark(p3), geomtag);
      } else {
        printf("PLC Error:  Two facets intersect at point");
        printf(" (%g,%g,%g).\n", ip[0], ip[1], ip[2]);
        printf("  Facet 1: [%d,%d,%d] #%d\n", pointmark(e1), pointmark(e2),
               pointmark(sorg(iface)), shellmark(iface));
        printf("  Facet 2: [%d,%d,%d] #%d\n", pointmark(p1), 
               pointmark(p2), pointmark(p3), geomtag);
      }
    } else if (types[0] == (int) ACROSSVERT) {
      // A vertex of the triangle and the edge intersect.
      point crosspt = NULL;
      if (poss[0] == 0) {
        crosspt = p1;
      } else if (poss[0] == 1) {
        crosspt = p2;
      } else if (poss[0] == 2) {
        crosspt = p3;
      } else {
        terminatetetgen(this, 2);
      }
      if (!issteinerpoint(crosspt)) {
        if (etype == 1) {
          printf("PLC Error:  A vertex and a segment intersect at (%g,%g,%g)\n",
                 crosspt[0], crosspt[1], crosspt[2]);
          printf("  Vertex:  #%d\n", pointmark(crosspt));
          printf("  Segment: [%d,%d] #%d (%d)\n", pointmark(e1), pointmark(e2),
                 shellmark(iface), facemark);
        } else {
          printf("PLC Error:  A vertex and a facet intersect at (%g,%g,%g)\n",
                 crosspt[0], crosspt[1], crosspt[2]);
          printf("  Vertex:  #%d\n", pointmark(crosspt));
          printf("  Facet:   [%d,%d,%d] #%d\n", pointmark(p1), 
                 pointmark(p2), pointmark(p3), geomtag);
        }
      } else {
        // It is a Steiner point. To be processed.
        terminatetetgen(this, 2);
      }
    } else if ((types[0] == (int) TOUCHFACE) ||
               (types[0] == (int) TOUCHEDGE)) {
      // The triangle and a vertex of the edge intersect.
      point touchpt = NULL;
      if (poss[1] == 0) {
        touchpt = org(*iedge);
      } else if (poss[1] == 1) {
        touchpt = dest(*iedge);
      } else {
        terminatetetgen(this, 2);
      }
      if (!issteinerpoint(touchpt)) {
        printf("PLC Error:  A vertex and a facet intersect at (%g,%g,%g)\n",
               touchpt[0], touchpt[1], touchpt[2]);
        printf("  Vertex:  #%d\n", pointmark(touchpt));
        printf("  Facet:   [%d,%d,%d] #%d\n", pointmark(p1), 
               pointmark(p2), pointmark(p3), geomtag);
      } else {
        // It is a Steiner point. To be processed.
        terminatetetgen(this, 2);
      }
    } else if (types[0] == (int) SHAREVERT) {
      terminatetetgen(this, 2);
    } else {
      terminatetetgen(this, 2);
    }
  } else if (intflag == 4) {
    if (types[0] == (int) SHAREFACE) {
      printf("PLC Error:  Two facets are overlapping.\n");
      printf("  Facet 1:   [%d,%d,%d] #%d\n", pointmark(e1), 
             pointmark(e2), pointmark(e3), facemark);
      printf("  Facet 2:   [%d,%d,%d] #%d\n", pointmark(p1), 
             pointmark(p2), pointmark(p3), geomtag);
    } else {
      terminatetetgen(this, 2);
    }
  } else {
    terminatetetgen(this, 2);
  }

  terminatetetgen(this, 3);
  return 0;
}